

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.h
# Opt level: O0

FileInfo * __thiscall
llbuild::basic::ChecksumOnlyFileSystem::getLinkInfo
          (FileInfo *__return_storage_ptr__,ChecksumOnlyFileSystem *this,string *path)

{
  pointer pFVar1;
  char *__path;
  FileInfo *info;
  undefined8 local_1129;
  undefined8 local_1121;
  undefined8 local_1119;
  allocator local_1111;
  string local_1110;
  FileChecksumHasherMD5 local_10f0;
  ssize_t local_1030;
  ssize_t len;
  char buff [4096];
  uint64_t local_20;
  string *path_local;
  ChecksumOnlyFileSystem *this_local;
  
  pFVar1 = std::
           unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
           ::operator->(&this->impl);
  (*pFVar1->_vptr_FileSystem[8])(__return_storage_ptr__,pFVar1,path);
  __return_storage_ptr__->device = 0;
  __return_storage_ptr__->inode = 0;
  memset(buff + 0xff8,0,0x10);
  (__return_storage_ptr__->modTime).seconds = buff._4088_8_;
  (__return_storage_ptr__->modTime).nanoseconds = local_20;
  (__return_storage_ptr__->modTime).seconds = 0;
  (__return_storage_ptr__->modTime).nanoseconds = 0;
  __path = (char *)std::__cxx11::string::c_str();
  local_1030 = readlink(__path,(char *)&len,0xfff);
  if (local_1030 == -1) {
    memset((void *)((long)&info + 7),0,0x20);
    *(undefined8 *)(__return_storage_ptr__->checksum).bytes = stack0xffffffffffffeecf;
    *(undefined8 *)((__return_storage_ptr__->checksum).bytes + 8) = local_1129;
    *(undefined8 *)((__return_storage_ptr__->checksum).bytes + 0x10) = local_1121;
    *(undefined8 *)((__return_storage_ptr__->checksum).bytes + 0x18) = local_1119;
  }
  else {
    buff[local_1030 + -8] = '\0';
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1110,(char *)&len,&local_1111);
    FileChecksumHasherMD5::FileChecksumHasherMD5(&local_10f0,&local_1110);
    FileChecksumHasher::readPathStringAndDigest
              (&local_10f0.super_FileChecksumHasher,&__return_storage_ptr__->checksum);
    FileChecksumHasherMD5::~FileChecksumHasherMD5(&local_10f0);
    std::__cxx11::string::~string((string *)&local_1110);
    std::allocator<char>::~allocator((allocator<char> *)&local_1111);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual FileInfo getLinkInfo(const std::string& path) override {
    auto info = impl->getLinkInfo(path);

    info.device = 0;
    info.inode = 0;
    info.modTime = FileTimestamp();
    info.modTime.seconds = 0;
    info.modTime.nanoseconds = 0;

#ifndef _WIN32
    char buff[PATH_MAX];
    ssize_t len = ::readlink(path.c_str(), buff, sizeof(buff)-1);
    if (len != -1) {
      buff[len] = '\0';
      PlatformSpecificHasher(std::string(buff)).readPathStringAndDigest(info.checksum);
    } else {
      info.checksum = {0};
    }
#else
    info.checksum = impl->getFileChecksum(path);
#endif
    return info;
  }